

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O0

void Abc_NtkDressMapSetPolarity(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pObj_00;
  int local_24;
  int i;
  Abc_Obj_t *pAnd;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,local_24);
    if (((pAVar4 != (Abc_Obj_t *)0x0) &&
        (pObj_00 = Abc_ObjRegular((pAVar4->field_6).pCopy), pObj_00 != (Abc_Obj_t *)0x0)) &&
       (uVar2 = Abc_ObjType(pObj_00), uVar2 != 0)) {
      uVar2 = *(uint *)&pObj_00->field_0x14;
      uVar3 = Abc_ObjIsComplement((pAVar4->field_6).pCopy);
      *(uint *)&pAVar4->field_0x14 =
           *(uint *)&pAVar4->field_0x14 & 0xffffff7f | ((uVar2 >> 7 & 1 ^ uVar3) & 1) << 7;
    }
  }
  return;
}

Assistant:

void Abc_NtkDressMapSetPolarity( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pAnd;
    int i;
    // each node refers to the the strash copy whose polarity is set
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( (pAnd = Abc_ObjRegular(pObj->pCopy)) && Abc_ObjType(pAnd) != ABC_OBJ_NONE ) // strashed object is present and legal
            pObj->fPhase = pAnd->fPhase ^ Abc_ObjIsComplement(pObj->pCopy);
    }
}